

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerInvisibility::EndEffect(APowerInvisibility *this)

{
  ActorFlags *pAVar1;
  ActorFlags3 *pAVar2;
  ActorFlags5 *pAVar3;
  AInventory *pAVar4;
  AInventory *pAVar5;
  PClass *pPVar6;
  int iVar7;
  AActor *pAVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  bool bVar10;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar8 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags;
      pAVar1->Value =
           pAVar1->Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags.Value | 0xfffbffff);
      pAVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags3;
      pAVar2->Value =
           pAVar2->Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags3.Value | 0xfffffff7);
      pAVar3 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags5;
      pAVar3->Value =
           pAVar3->Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags5.Value | 0xefffffff);
      ((this->super_APowerup).super_AInventory.Owner.field_0.p)->RenderStyle = LegacyRenderStyles[1]
      ;
      ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Alpha = 1.0;
      pAVar8 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
      if ((pAVar8 != (AActor *)0x0) &&
         (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
        pAVar8 = (AActor *)0x0;
      }
      pAVar4 = (pAVar8->Inventory).field_0.p;
      pPVar6 = RegistrationInfo.MyClass;
      if ((pAVar4 != (AInventory *)0x0) &&
         (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar8->Inventory).field_0.p = (AInventory *)0x0;
        pAVar4 = (AInventory *)0x0;
        pPVar6 = RegistrationInfo.MyClass;
      }
      while (pAVar5 = pAVar4, RegistrationInfo.MyClass = pPVar6, pAVar5 != (AInventory *)0x0) {
        if ((((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.super_DThinker.
            super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.
                     super_DThinker.super_DObject._vptr_DObject)(pAVar5);
          (((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.super_DThinker.
          super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
        }
        pPVar9 = (pAVar5->super_AActor).super_DThinker.super_DObject.Class;
        bVar10 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar6 && bVar10) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar10 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!(bool)(bVar10 ^ 1U | pAVar5 == (AInventory *)this)) {
          (*(((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.super_DThinker.
            super_DObject._vptr_DObject[0x2c])(pAVar5);
        }
        pAVar4 = (((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.Inventory.
                 field_0.p;
        pPVar6 = RegistrationInfo.MyClass;
        if ((pAVar4 != (AInventory *)0x0) &&
           (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar5->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar4 = (AInventory *)0x0;
          pPVar6 = RegistrationInfo.MyClass;
        }
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerInvisibility::EndEffect ()
{
	Super::EndEffect();
	if (Owner != NULL)
	{
		Owner->flags  &= ~(flags  & INVISIBILITY_FLAGS1);
		Owner->flags3 &= ~(flags3 & INVISIBILITY_FLAGS3);
		Owner->flags5 &= ~(flags5 & INVISIBILITY_FLAGS5);

		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;

		// Check whether there are other invisibility items and refresh their effect.
		// If this isn't done there will be one incorrectly drawn frame when this
		// item expires.
		AInventory *item = Owner->Inventory;
		while (item != NULL)
		{
			if (item->IsKindOf(RUNTIME_CLASS(APowerInvisibility)) && item != this)
			{
				static_cast<APowerInvisibility*>(item)->DoEffect();
			}
			item = item->Inventory;
		}
	}
}